

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O3

int despot::util::tinyxml::TiXmlBase::IsAlphaNum(uchar anyByte,TiXmlEncoding param_2)

{
  int iVar1;
  
  if (anyByte < 0x7f) {
    iVar1 = isalnum((uint)anyByte);
    return iVar1;
  }
  return 1;
}

Assistant:

int TiXmlBase::IsAlphaNum(unsigned char anyByte,
	TiXmlEncoding /*encoding*/) {
	// This will only work for low-ascii, everything else is assumed to be a valid
	// letter. I'm not sure this is the best approach, but it is quite tricky trying
	// to figure out alhabetical vs. not across encoding. So take a very
	// conservative approach.

	//	if ( encoding == TIXML_ENCODING_UTF8 )
	//	{
	if (anyByte < 127)
		return isalnum(anyByte);
	else
		return 1; // What else to do? The unicode set is huge...get the english ones right.
	//	}
	//	else
	//	{
	//		return isalnum( anyByte );
	//	}
}